

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::SimpleFormatter::formatAndReplace
          (SimpleFormatter *this,UnicodeString **values,int32_t valuesLength,UnicodeString *result,
          int32_t *offsets,int32_t offsetsLength,UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  ushort uVar3;
  ushort uVar4;
  char16_t *compiledPattern;
  int32_t compiledPatternLength;
  bool bVar5;
  int iVar6;
  UnicodeString resultCopy;
  
  if (U_ZERO_ERROR < *errorCode) {
    return result;
  }
  if ((valuesLength < 0) || (values == (UnicodeString **)0x0 && valuesLength != 0)) {
LAB_0030d8ed:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return result;
  }
  if ((offsetsLength < 0) || (offsets == (int32_t *)0x0 && offsetsLength != 0)) goto LAB_0030d8ed;
  compiledPattern = icu_63::UnicodeString::getBuffer(&this->compiledPattern);
  sVar1 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    compiledPatternLength = (this->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    compiledPatternLength = (int)sVar1 >> 5;
  }
  if (compiledPatternLength == 0) {
    resultCopy.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80
    ;
    resultCopy.fUnion.fStackFields.fLengthAndFlags = 2;
  }
  else {
    if ((uint)valuesLength < (uint)(ushort)*compiledPattern) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return result;
    }
    resultCopy.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80
    ;
    resultCopy.fUnion.fStackFields.fLengthAndFlags = 2;
    if (*compiledPattern != L'\0') {
      iVar6 = 1;
      bVar5 = true;
      while (iVar6 < compiledPatternLength) {
        cVar2 = compiledPattern[iVar6];
        if ((ulong)(ushort)cVar2 < 0x100) {
          iVar6 = iVar6 + 1;
          if (values[(ushort)cVar2] == result) {
            if (iVar6 == 2) {
              bVar5 = false;
              iVar6 = 2;
            }
            else if (((ushort)resultCopy.fUnion.fStackFields.fLengthAndFlags < 0x20) &&
                    (0x1f < (ushort)(result->fUnion).fStackFields.fLengthAndFlags)) {
              icu_63::UnicodeString::operator=(&resultCopy,result);
            }
          }
        }
        else {
          iVar6 = iVar6 + (uint)(ushort)cVar2 + -0xff;
        }
      }
      if (!bVar5) goto LAB_0030d9e0;
    }
  }
  uVar3 = (result->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = 2;
  if ((uVar3 & 1) == 0) {
    uVar4 = uVar3 & 0x1e;
  }
  (result->fUnion).fStackFields.fLengthAndFlags = uVar4;
LAB_0030d9e0:
  format(compiledPattern,compiledPatternLength,values,result,&resultCopy,'\0',offsets,offsetsLength,
         errorCode);
  icu_63::UnicodeString::~UnicodeString(&resultCopy);
  return result;
}

Assistant:

UnicodeString &SimpleFormatter::formatAndReplace(
        const UnicodeString *const *values, int32_t valuesLength,
        UnicodeString &result,
        int32_t *offsets, int32_t offsetsLength, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return result;
    }
    if (isInvalidArray(values, valuesLength) || isInvalidArray(offsets, offsetsLength)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }
    const UChar *cp = compiledPattern.getBuffer();
    int32_t cpLength = compiledPattern.length();
    if (valuesLength < getArgumentLimit(cp, cpLength)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    // If the pattern starts with an argument whose value is the same object
    // as the result, then we keep the result contents and append to it.
    // Otherwise we replace its contents.
    int32_t firstArg = -1;
    // If any non-initial argument value is the same object as the result,
    // then we first copy its contents and use that instead while formatting.
    UnicodeString resultCopy;
    if (getArgumentLimit(cp, cpLength) > 0) {
        for (int32_t i = 1; i < cpLength;) {
            int32_t n = cp[i++];
            if (n < ARG_NUM_LIMIT) {
                if (values[n] == &result) {
                    if (i == 2) {
                        firstArg = n;
                    } else if (resultCopy.isEmpty() && !result.isEmpty()) {
                        resultCopy = result;
                    }
                }
            } else {
                i += n - ARG_NUM_LIMIT;
            }
        }
    }
    if (firstArg < 0) {
        result.remove();
    }
    return format(cp, cpLength, values,
                  result, &resultCopy, FALSE,
                  offsets, offsetsLength, errorCode);
}